

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall
el::base::utils::CommandLineArgs::setArgs(CommandLineArgs *this,int argc,char **argv)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  long in_RDX;
  int in_ESI;
  char *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_basic_string<char>_>_&&>::value,_pair<iterator,_bool>_>
  _Var4;
  string key;
  char *v;
  int i;
  value_type *in_stack_fffffffffffffe58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe60;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe68;
  allocator *in_stack_fffffffffffffe70;
  CommandLineArgs *this_00;
  CommandLineArgs *in_stack_fffffffffffffee0;
  string local_118 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_f8;
  undefined1 local_f0;
  allocator local_e1;
  string local_e0 [96];
  string local_80 [55];
  undefined1 local_49 [33];
  char *local_28;
  int local_1c;
  long local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x229ea7);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x229eb8);
  if ((local_c != 0) && (local_18 != 0)) {
    *(int *)(in_RDI + 8) = local_c;
    *(long *)(in_RDI + 0x10) = local_18;
    for (local_1c = 1; local_1c < *(int *)(in_RDI + 8); local_1c = local_1c + 1) {
      local_28 = strstr(*(char **)(*(long *)(in_RDI + 0x10) + (long)local_1c * 8),"=");
      if ((local_28 != (char *)0x0) && (sVar2 = strlen(local_28), sVar2 != 0)) {
        pcVar3 = *(char **)(*(long *)(in_RDI + 0x10) + (long)local_1c * 8);
        this_00 = (CommandLineArgs *)local_49;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)(local_49 + 1),pcVar3,(allocator *)this_00);
        ::std::allocator<char>::~allocator((allocator<char> *)local_49);
        ::std::__cxx11::string::find_first_of((char)(local_49 + 1),0x3d);
        ::std::__cxx11::string::substr((ulong)local_80,(ulong)(local_49 + 1));
        ::std::__cxx11::string::operator=((string *)(local_49 + 1),local_80);
        ::std::__cxx11::string::~string(local_80);
        ::std::__cxx11::string::c_str();
        bVar1 = hasParamWithValue(this_00,pcVar3);
        if (!bVar1) {
          pcVar3 = local_28 + 1;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_e0,pcVar3,&local_e1);
          ::std::make_pair<std::__cxx11::string&,std::__cxx11::string>
                    (&in_stack_fffffffffffffe68->first,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe60);
          _Var4 = ::std::
                  unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                            ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
          local_f8._M_cur =
               (__node_type *)
               _Var4.first.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ._M_cur;
          local_f0 = _Var4.second;
          ::std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(in_stack_fffffffffffffe60);
          ::std::__cxx11::string::~string(local_e0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_e1);
        }
        ::std::__cxx11::string::~string((string *)(local_49 + 1));
      }
      if ((local_28 == (char *)0x0) && (bVar1 = hasParam(in_stack_fffffffffffffee0,in_RDI), !bVar1))
      {
        in_stack_fffffffffffffe60 =
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(in_RDI + 0x50);
        in_stack_fffffffffffffe68 =
             *(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               **)(*(long *)(in_RDI + 0x10) + (long)local_1c * 8);
        in_stack_fffffffffffffe70 = (allocator *)&stack0xfffffffffffffee7;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_118,(char *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe70);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        ::std::__cxx11::string::~string(local_118);
        ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffee7);
      }
    }
  }
  return;
}

Assistant:

void CommandLineArgs::setArgs(int argc, char** argv) {
  m_params.clear();
  m_paramsWithValue.clear();
  if (argc == 0 || argv == nullptr) {
    return;
  }
  m_argc = argc;
  m_argv = argv;
  for (int i = 1; i < m_argc; ++i) {
    const char* v = (strstr(m_argv[i], "="));
    if (v != nullptr && strlen(v) > 0) {
      std::string key = std::string(m_argv[i]);
      key = key.substr(0, key.find_first_of('='));
      if (hasParamWithValue(key.c_str())) {
        ELPP_INTERNAL_INFO(1, "Skipping [" << key << "] arg since it already has value ["
                           << getParamValue(key.c_str()) << "]");
      } else {
        m_paramsWithValue.insert(std::make_pair(key, std::string(v + 1)));
      }
    }
    if (v == nullptr) {
      if (hasParam(m_argv[i])) {
        ELPP_INTERNAL_INFO(1, "Skipping [" << m_argv[i] << "] arg since it already exists");
      } else {
        m_params.push_back(std::string(m_argv[i]));
      }
    }
  }
}